

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O3

int find_process_slot(int pid)

{
  int *piVar1;
  long lVar2;
  
  if (0 < (long)NPROCS) {
    piVar1 = &UJ->PID;
    lVar2 = 0;
    do {
      if (*piVar1 == pid) {
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
      piVar1 = piVar1 + 6;
    } while (NPROCS != lVar2);
  }
  return -1;
}

Assistant:

int find_process_slot(int pid)
/* Find a slot with the specified pid */

{
  for (int slot = 0; slot < NPROCS; slot++)
    if (UJ[slot].PID == pid) {
      DBPRINT(("find_process_slot = %d.\n", slot));
      return slot;
    }
  return -1;
}